

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O2

void __thiscall Iex::BaseExc::BaseExc(BaseExc *this,char *s)

{
  allocator local_1a;
  allocator local_19;
  
  if (s == (char *)0x0) {
    s = "";
  }
  std::__cxx11::string::string((string *)&this->super_string,s,&local_19);
  *(undefined ***)this = &PTR__BaseExc_0015dd58;
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    std::__cxx11::string::string((string *)&this->_stackTrace,"",&local_1a);
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)();
  }
  return;
}

Assistant:

BaseExc::BaseExc (const char* s) throw () :
    std::string (s? s: ""),
    _stackTrace (currentStackTracer? currentStackTracer(): "")
{
    // empty
}